

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_list_certs_der(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  long lVar1;
  long *data;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  Tcl_Obj *pTVar7;
  char *pcVar8;
  Tcl_Obj *pTVar9;
  Tcl_Obj *pTVar10;
  Tcl_Obj *pTVar11;
  ProcErrorProc *pPVar12;
  CK_RV CVar13;
  long *plVar14;
  tclpkcs11_handle *handle;
  Tcl_Obj *local_100;
  Tcl_Obj *local_f8;
  Tcl_Obj *local_f0;
  CK_OBJECT_HANDLE hObject;
  Tcl_Obj *local_d8;
  Tcl_Obj *local_d0;
  tclpkcs11_handle *local_c8;
  Tcl_Interp *local_c0;
  CK_ULONG ulObjectCount;
  long slotid_long;
  CK_ATTRIBUTE template [4];
  CK_ATTRIBUTE cert_templ [1];
  
  cert_templ[0].ulValueLen = 8;
  cert_templ[0].type = 0;
  cert_templ[0].pValue = &tclpkcs11_list_certs_der::oclass_cert;
  template[0].ulValueLen = 0;
  template[2].pValue = (CK_VOID_PTR)0x0;
  template[2].ulValueLen = 0;
  template[3].pValue = (CK_VOID_PTR)0x0;
  template[3].ulValueLen = 0;
  template[1].pValue = (CK_VOID_PTR)0x0;
  template[1].ulValueLen = 0;
  template[0].type = 0;
  template[0].pValue = (CK_VOID_PTR)0x0;
  template[1].type = 3;
  template[2].type = 0x102;
  template[3].type = 0x11;
  if (cd == (ClientData)0x0) {
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid clientdata";
  }
  else if (objc == 3) {
    pTVar7 = objv[1];
    pTVar11 = objv[2];
    lVar6 = (**(code **)((long)cd + 0x40))(cd,pTVar7);
    if ((lVar6 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar6 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar5 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar11,&slotid_long)
      ;
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = tclpkcs11_start_session(handle,slotid_long);
      if (iVar5 == 0) {
        CVar13 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,cert_templ,1);
        if (CVar13 == 0) {
          local_d8 = pTVar7;
          pTVar7 = (*tclStubsPtr->tcl_NewObj)();
          local_d0 = pTVar11;
          local_c8 = handle;
          local_c0 = interp;
          do {
            CVar13 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&ulObjectCount);
            if (CVar13 != 0) {
              pPVar12 = tclStubsPtr->tcl_SetObjResult;
LAB_001042a8:
              pTVar7 = tclpkcs11_pkcs11_error(CVar13);
LAB_001042ca:
              (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar7);
              (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
              return 1;
            }
            if (ulObjectCount != 1) {
              if (ulObjectCount == 0) {
                (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar7);
                return 0;
              }
              pPVar12 = tclStubsPtr->tcl_SetObjResult;
              pTVar7 = (*tclStubsPtr->tcl_NewStringObj)
                                 ("FindObjects() returned a weird number of objects.",-1);
              goto LAB_001042ca;
            }
            for (lVar6 = 8; lVar6 != 0x68; lVar6 = lVar6 + 0x18) {
              pcVar8 = *(char **)((long)&template[0].type + lVar6);
              if (pcVar8 != (char *)0x0) {
                (*tclStubsPtr->tcl_Free)(pcVar8);
              }
              *(undefined8 *)((long)&template[0].type + lVar6) = 0;
              *(undefined8 *)((long)&template[0].pValue + lVar6) = 0;
            }
            CVar13 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,template,4);
            if (((CVar13 < 0x13) && ((0x60001UL >> (CVar13 & 0x3f) & 1) != 0)) || (CVar13 == 0x150))
            {
              for (lVar6 = 0x10; lVar6 != 0x70; lVar6 = lVar6 + 0x18) {
                lVar1 = *(long *)((long)&template[0].type + lVar6);
                if (lVar1 != -1) {
                  pcVar8 = (*tclStubsPtr->tcl_Alloc)((uint)lVar1);
                  *(char **)((long)template + lVar6 + -8) = pcVar8;
                }
              }
              CVar13 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,template,4);
              if (((0x12 < CVar13) || ((0x60001UL >> (CVar13 & 0x3f) & 1) == 0)) &&
                 (CVar13 != 0x150)) {
                for (lVar6 = 8; lVar6 != 0x68; lVar6 = lVar6 + 0x18) {
                  pcVar8 = *(char **)((long)&template[0].type + lVar6);
                  if (pcVar8 != (char *)0x0) {
                    (*tclStubsPtr->tcl_Free)(pcVar8);
                  }
                }
                pPVar12 = tclStubsPtr->tcl_SetObjResult;
                goto LAB_001042a8;
              }
              local_100 = (Tcl_Obj *)0x0;
              local_f8 = (Tcl_Obj *)0x0;
              local_f0 = (Tcl_Obj *)0x0;
              bVar3 = false;
              plVar14 = (long *)0x0;
              for (lVar6 = 0x10; interp = local_c0, handle = local_c8, pTVar11 = local_d0,
                  lVar6 != 0x70; lVar6 = lVar6 + 0x18) {
                data = *(long **)((long)template + lVar6 + -8);
                if (data != (long *)0x0) {
                  lVar1 = *(long *)((long)&ulObjectCount + lVar6);
                  bVar4 = bVar3;
                  if (lVar1 == 0x102) {
                    local_f8 = tclpkcs11_bytearray_to_string
                                         ((uchar *)data,
                                          *(unsigned_long *)((long)&template[0].type + lVar6));
                  }
                  else if (lVar1 == 3) {
                    local_f0 = (*tclStubsPtr->tcl_NewStringObj)
                                         ((char *)data,*(int *)((long)&template[0].type + lVar6));
                  }
                  else if (lVar1 == 0x11) {
                    if (plVar14 == (long *)0x0) {
                      plVar14 = (long *)0x0;
                    }
                    else {
                      local_100 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&template[0].type + lVar6));
                    }
                  }
                  else if ((lVar1 == 0) && (plVar14 = data, bVar4 = true, *data != 1))
                  goto LAB_00104087;
                  (*tclStubsPtr->tcl_Free)(*(char **)((long)template + lVar6 + -8));
                  *(undefined8 *)((long)template + lVar6 + -8) = 0;
                  bVar3 = bVar4;
                }
LAB_00104087:
              }
              if ((((bVar3) && (local_f0 != (Tcl_Obj *)0x0)) && (local_f8 != (Tcl_Obj *)0x0)) &&
                 (local_100 != (Tcl_Obj *)0x0)) {
                pTVar9 = (*tclStubsPtr->tcl_NewObj)();
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_handle",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar10);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar9,local_d8);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_slotid",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar10);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_id",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar9,local_f8);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_label",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar9,local_f0);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("cert_der",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar9,local_100);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("type",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11",-1);
                (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar7,pTVar9);
              }
            }
          } while( true );
        }
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        CVar13 = (CK_RV)iVar5;
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar7 = tclpkcs11_pkcs11_error(CVar13);
      goto LAB_00103e56;
    }
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid handle";
  }
  else {
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "wrong # args: should be \"pki::pkcs11::listcertsder handle slot\"";
  }
  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)(pcVar8,-1);
LAB_00103e56:
  (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar7);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_certs_der(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  Tcl_Obj *obj_label, *obj_id, *obj_cert_der;
  Tcl_Obj *ret_list, *curr_item_list;
  int tcl_rv;
  int type_cert;
  CK_SLOT_ID slotid;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  static CK_OBJECT_CLASS     oclass_cert     = CKO_CERTIFICATE;
  //	                           {CKA_ID, NULL, 0},
  CK_ATTRIBUTE cert_templ[] = {
    {CKA_CLASS, &oclass_cert, sizeof(oclass_cert)},
  };
  CK_ATTRIBUTE template[] = {
    {CKA_CLASS, NULL, 0},
    {CKA_LABEL, NULL, 0},
    {CKA_ID, NULL, 0},
    {CKA_VALUE, NULL, 0}
  }, *curr_attr;
  CK_ULONG curr_attr_idx;
  CK_OBJECT_CLASS *objectclass;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listcertsder handle slot\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  //	chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session, NULL, 0);
  chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  cert_templ, sizeof(cert_templ) / sizeof(cert_templ[0]));
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();
  while (1) {
    type_cert = 0;	
    chk_rv = handle->pkcs11->C_FindObjects(handle->session, &hObject, 1, &ulObjectCount);
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    if (ulObjectCount == 0) {
      break;
    }

    if (ulObjectCount != 1) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("FindObjects() returned a weird number of objects.", -1));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];
      if (curr_attr->pValue) {
        ckfree(curr_attr->pValue);
      }

      curr_attr->pValue = NULL;
      curr_attr->ulValueLen = 0;
    }

    /* Determine size of values to allocate */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv == CKR_ATTRIBUTE_TYPE_INVALID || chk_rv == CKR_ATTRIBUTE_SENSITIVE || chk_rv == CKR_BUFFER_TOO_SMALL) {
      chk_rv = CKR_OK;
    }

    if (chk_rv != CKR_OK) {
      /* Skip this object if we are not able to process it */
      continue;
    }

    /* Allocate values */
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (((CK_LONG) curr_attr->ulValueLen) != ((CK_LONG) -1)) {
        curr_attr->pValue = (void *) ckalloc(curr_attr->ulValueLen);
      }
    }

    /* Populate template values */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv != CKR_OK && chk_rv != CKR_ATTRIBUTE_SENSITIVE && chk_rv != CKR_ATTRIBUTE_TYPE_INVALID && chk_rv != CKR_BUFFER_TOO_SMALL) {
      /* Return an error if we are unable to process this entry due to unexpected errors */
      for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
        curr_attr = &template[curr_attr_idx];
        if (curr_attr->pValue) {
          ckfree(curr_attr->pValue);
        }
      }

      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    /* Extract certificate data */
    obj_label = NULL;
    obj_id = NULL;
    obj_cert_der = NULL;
    objectclass = NULL;
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (!curr_attr->pValue) {
        continue;
      }

      switch (curr_attr->type) {
        case CKA_CLASS:
          objectclass = (CK_OBJECT_CLASS *) curr_attr->pValue;
          if (*objectclass != CKO_CERTIFICATE) {
            continue;
          }
          type_cert = 1;
          break;
        case CKA_LABEL:
          obj_label = Tcl_NewStringObj(curr_attr->pValue, curr_attr->ulValueLen);
          break;
        case CKA_ID:
          /* Convert the ID into a readable string */
          obj_id = tclpkcs11_bytearray_to_string(curr_attr->pValue, curr_attr->ulValueLen);

          break;
        case CKA_VALUE:
          /*LISSI*/
          //fprintf (stderr, "tclpkcs11_list_certs_der: LEN_VALUE=%lu\n", curr_attr->ulValueLen);
          if (!objectclass) {
            break;
          }

          /* Convert the DER_CERT into a readable string */
          obj_cert_der = tclpkcs11_bytearray_to_string(curr_attr->pValue, curr_attr->ulValueLen);

          break;
      }

      ckfree(curr_attr->pValue);
      curr_attr->pValue = NULL;
    }
    if (type_cert == 0) {
      continue;
    }

    /* Add this certificate data to return list, if all found */
    if (obj_label == NULL || obj_id == NULL || obj_cert_der == NULL) {
      continue;
    }

    /* Create the current item list */
    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_handle", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_handle);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_slotid", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_slotid);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_id", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_id);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_label", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_label);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("cert_der", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_cert_der);

    /*
    * Override the "type" so that [array set] returns our new
    * type, but we can still parse through the list and figure
    * out the real subordinate type
    */
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("type", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11", -1));

    /* Add the current item to the return value list */
    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  /* Terminate search */
  handle->pkcs11->C_FindObjectsFinal(handle->session);

  /* Return */
  Tcl_SetObjResult(interp, ret_list);
  //	Tcl_SetObjResult(interp, curr_item_list);

  return(TCL_OK);
}